

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<signed_char,_duckdb::ModeStandard<signed_char>_>::ModeRm
          (ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *this,idx_t frame)

{
  size_t sVar1;
  char *__k;
  mapped_type *pmVar2;
  
  __k = GetCell(this,frame);
  pmVar2 = ::std::__detail::
           _Map_base<signed_char,_std::pair<const_signed_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_signed_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<signed_char,_std::pair<const_signed_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_signed_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar1 = pmVar2->count;
  this->nonzero = this->nonzero - (ulong)(sVar1 == 1);
  pmVar2->count = sVar1 - 1;
  if ((this->count == sVar1) && (*__k == *this->mode)) {
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}